

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllocationPolicyManager.h
# Opt level: O1

bool __thiscall
AllocationPolicyManager::RequestAlloc
          (AllocationPolicyManager *this,size_t byteCount,bool externalAlloc)

{
  bool bVar1;
  ulong uVar2;
  
  if (this->supportConcurrency != true) {
    uVar2 = this->currentMemory + byteCount;
    if ((((CARRY8(this->currentMemory,byteCount)) || (this->memoryLimit < uVar2)) ||
        ((this->memoryAllocationCallback != (PageAllocatorMemoryAllocationCallback)0x0 &&
         (bVar1 = (*this->memoryAllocationCallback)(this->context,MemoryAllocate,byteCount), !bVar1)
         ))) && (!externalAlloc)) {
      if (this->memoryAllocationCallback != (PageAllocatorMemoryAllocationCallback)0x0) {
        (*this->memoryAllocationCallback)(this->context,MemoryFailure,byteCount);
      }
      return false;
    }
    this->currentMemory = uVar2;
    return true;
  }
  CCLock::Enter(&(this->cs).super_CCLock);
  uVar2 = this->currentMemory + byteCount;
  if ((CARRY8(this->currentMemory,byteCount)) || (this->memoryLimit < uVar2)) {
    if (!externalAlloc) goto LAB_00703896;
  }
  else if ((this->memoryAllocationCallback != (PageAllocatorMemoryAllocationCallback)0x0) &&
          (bVar1 = (*this->memoryAllocationCallback)(this->context,MemoryAllocate,byteCount),
          !bVar1 && !externalAlloc)) {
LAB_00703896:
    if (this->memoryAllocationCallback != (PageAllocatorMemoryAllocationCallback)0x0) {
      (*this->memoryAllocationCallback)(this->context,MemoryFailure,byteCount);
    }
    bVar1 = false;
    goto LAB_007038ef;
  }
  this->currentMemory = uVar2;
  bVar1 = true;
LAB_007038ef:
  CCLock::Leave(&(this->cs).super_CCLock);
  return bVar1;
}

Assistant:

bool RequestAlloc(DECLSPEC_GUARD_OVERFLOW size_t byteCount, bool externalAlloc = false)
    {
        if (supportConcurrency)
        {
            AutoCriticalSection auto_cs(&cs);
            return RequestAllocImpl(byteCount, externalAlloc);
        }
        else
        {
            return RequestAllocImpl(byteCount, externalAlloc);
        }
    }